

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side4_8d_filter(double *p0,double *p1,double *p2,double *p3,double *p4,double *q0,double *q1,
                   double *q2,double *q3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar30;
  double dVar31;
  undefined1 auVar27 [16];
  double dVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar48;
  double dVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar50;
  undefined4 uVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar82;
  double dVar83;
  double dVar84;
  undefined1 auVar81 [16];
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar106;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar114;
  undefined1 auVar113 [16];
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar121;
  undefined1 auVar120 [16];
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar129;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  double dVar130;
  undefined1 local_668 [32];
  undefined1 local_648 [16];
  undefined1 local_638 [96];
  undefined1 local_5d8 [24];
  double dStack_5c0;
  undefined1 local_578 [40];
  double dStack_550;
  double dStack_4e0;
  
  dVar52 = p0[4];
  dVar125 = p0[5];
  dVar118 = *p0;
  dVar4 = p0[1];
  dVar43 = p0[2];
  dVar112 = p0[3];
  dVar78 = p2[2] - dVar43;
  dVar82 = q1[5] - dVar125;
  dVar122 = p3[5] - dVar125;
  dVar129 = q2[5] - dVar125;
  dVar44 = p0[6];
  dVar45 = p0[7];
  dVar61 = p1[2] - dVar43;
  dVar64 = q3[4] - dVar52;
  dVar34 = p1[5] - dVar125;
  dVar48 = q3[5] - dVar125;
  dVar115 = p3[4] - dVar52;
  dVar121 = q2[4] - dVar52;
  dVar67 = p3[6] - dVar44;
  dVar72 = q2[6] - dVar44;
  dVar7 = p2[4] - dVar52;
  dVar96 = q1[6] - dVar44;
  dVar26 = q1[4] - dVar52;
  dVar75 = p2[6] - dVar44;
  dVar62 = *p2 - dVar118;
  dVar65 = q1[2] - dVar43;
  dVar85 = *q1 - dVar118;
  dVar86 = ABS(dVar85);
  dVar17 = p2[3] - dVar112;
  dVar30 = q1[1] - dVar4;
  local_668._8_8_ = ABS(dVar30);
  local_668._0_8_ = ABS(dVar17);
  dVar83 = (double)local_668._8_8_;
  if ((double)local_668._8_8_ <= dVar86) {
    dVar83 = dVar86;
  }
  local_638._8_8_ = ABS(dVar65);
  local_638._0_8_ = ABS(dVar62);
  dVar19 = (double)local_638._8_8_;
  if ((double)local_638._8_8_ <= dVar83) {
    dVar19 = dVar83;
  }
  dVar18 = q1[3] - dVar112;
  dVar35 = p2[1] - dVar4;
  local_648._8_8_ = ABS(dVar18);
  local_648._0_8_ = ABS(dVar35);
  dVar83 = (double)local_648._8_8_;
  if ((double)local_648._8_8_ <= dVar19) {
    dVar83 = dVar19;
  }
  auVar1._8_4_ = SUB84(dVar75,0);
  auVar1._0_8_ = dVar26;
  auVar1._12_4_ = (int)((ulong)dVar75 >> 0x20);
  dVar19 = ABS(dVar26);
  auVar29._8_4_ = SUB84(dVar19,0);
  auVar29._0_8_ = ABS(dVar75);
  auVar29._12_4_ = (int)((ulong)dVar19 >> 0x20);
  if (dVar19 <= dVar83) {
    dVar19 = dVar83;
  }
  dVar83 = ABS(dVar82);
  dVar75 = dVar83;
  if (dVar83 <= dVar19) {
    dVar75 = dVar19;
  }
  auVar5._8_4_ = SUB84(dVar96,0);
  auVar5._0_8_ = dVar7;
  auVar5._12_4_ = (int)((ulong)dVar96 >> 0x20);
  dVar96 = ABS(dVar96);
  auVar128._8_4_ = SUB84(dVar96,0);
  auVar128._0_8_ = ABS(dVar7);
  auVar128._12_4_ = (int)((ulong)dVar96 >> 0x20);
  if (dVar96 <= dVar75) {
    dVar96 = dVar75;
  }
  dVar19 = p2[7] - dVar45;
  dVar31 = q1[7] - dVar45;
  local_578._8_8_ = ABS(dVar31);
  local_578._0_8_ = ABS(dVar19);
  dVar75 = (double)local_578._8_8_;
  if ((double)local_578._8_8_ <= dVar96) {
    dVar75 = dVar96;
  }
  dVar79 = *p3 - dVar118;
  dVar84 = q2[1] - dVar4;
  dVar95 = *q2 - dVar118;
  dVar96 = ABS(dVar95);
  auVar81._0_8_ = ABS(dVar79);
  auVar81._8_8_ = ABS(dVar84);
  dVar88 = auVar81._8_8_;
  if (auVar81._8_8_ <= dVar96) {
    dVar88 = dVar96;
  }
  if (dVar96 <= dVar75) {
    dVar96 = dVar75;
  }
  dVar36 = p3[3] - dVar112;
  auVar27._0_8_ = ABS(dVar36);
  auVar27._8_8_ = dVar96;
  dVar96 = *q0 - dVar118;
  dVar106 = q0[1] - dVar4;
  dVar75 = ABS(dVar106);
  if (ABS(dVar106) <= ABS(dVar96)) {
    dVar75 = ABS(dVar96);
  }
  dVar97 = q0[2] - dVar43;
  dVar98 = ABS(dVar97);
  if (ABS(dVar97) <= dVar75) {
    dVar98 = dVar75;
  }
  dVar107 = q0[3] - dVar112;
  dVar75 = ABS(dVar107);
  if (ABS(dVar107) <= dVar98) {
    dVar75 = dVar98;
  }
  dVar99 = q0[4] - dVar52;
  dVar98 = ABS(dVar99);
  if (ABS(dVar99) <= dVar75) {
    dVar98 = dVar75;
  }
  dVar108 = q0[5] - dVar125;
  dVar75 = ABS(dVar108);
  if (ABS(dVar108) <= dVar98) {
    dVar75 = dVar98;
  }
  auVar81 = maxpd(auVar81,auVar27);
  dVar98 = p1[1] - dVar4;
  dVar66 = q3[6] - dVar44;
  dVar37 = q0[6] - dVar44;
  dVar38 = ABS(dVar37);
  if (ABS(dVar37) <= dVar75) {
    dVar38 = dVar75;
  }
  dVar100 = q0[7] - dVar45;
  dVar75 = ABS(dVar100);
  if (ABS(dVar100) <= dVar38) {
    dVar75 = dVar38;
  }
  if (dVar86 <= dVar75) {
    dVar86 = dVar75;
  }
  dVar38 = p2[5] - dVar125;
  auVar56._0_8_ = ABS(dVar38);
  auVar56._8_8_ = dVar86;
  auVar27 = maxpd(local_668._0_16_,auVar56);
  dVar86 = p3[1] - dVar4;
  dVar87 = q2[2] - dVar43;
  auVar105._0_8_ = ABS(dVar86);
  auVar105._8_8_ = ABS(dVar87);
  dVar75 = auVar105._8_8_;
  if (auVar105._8_8_ <= dVar88) {
    dVar75 = dVar88;
  }
  dVar109 = p3[2] - dVar43;
  dVar114 = q2[3] - dVar112;
  auVar113._0_8_ = ABS(dVar109);
  auVar113._8_8_ = ABS(dVar114);
  dVar88 = auVar113._8_8_;
  if (auVar113._8_8_ <= dVar75) {
    dVar88 = dVar75;
  }
  auVar120._0_8_ = ABS(dVar115);
  auVar120._8_8_ = ABS(dVar121);
  dVar75 = auVar120._8_8_;
  if (auVar120._8_8_ <= dVar88) {
    dVar75 = dVar88;
  }
  auVar126._0_8_ = ABS(dVar122);
  auVar126._8_8_ = ABS(dVar129);
  dVar88 = auVar126._8_8_;
  if (auVar126._8_8_ <= dVar75) {
    dVar88 = dVar75;
  }
  auVar104._0_8_ = ABS(dVar67);
  auVar104._8_8_ = ABS(dVar72);
  dVar75 = auVar104._8_8_;
  if (auVar104._8_8_ <= dVar88) {
    dVar75 = dVar88;
  }
  dVar88 = p3[7] - dVar45;
  dVar21 = q2[7] - dVar45;
  auVar6._8_4_ = SUB84(dVar21,0);
  auVar6._0_8_ = dVar88;
  auVar6._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar21 = ABS(dVar21);
  dVar20 = dVar21;
  if (dVar21 <= dVar75) {
    dVar20 = dVar75;
  }
  dVar39 = *q3 - dVar118;
  dVar75 = ABS(dVar39);
  if (ABS(dVar39) <= dVar20) {
    dVar75 = dVar20;
  }
  dVar89 = p1[4] - dVar52;
  auVar93._0_8_ = ABS(dVar89);
  auVar93._8_8_ = dVar75;
  dVar20 = p1[3] - dVar112;
  dVar32 = q3[1] - dVar4;
  auVar55._0_8_ = ABS(dVar20);
  auVar55._8_8_ = ABS(dVar32);
  auVar56 = maxpd(auVar55,auVar93);
  dVar68 = p1[7] - dVar45;
  dVar73 = q3[2] - dVar43;
  dVar74 = q3[3] - dVar112;
  dVar40 = p1[6] - dVar44;
  dVar49 = q3[7] - dVar45;
  auVar94._0_8_ = ABS(dVar61);
  auVar94._8_8_ = ABS(dVar64);
  auVar28._0_8_ = ABS(dVar34);
  auVar28._8_8_ = ABS(dVar48);
  local_5d8._8_8_ = ABS(dVar49);
  local_5d8._0_8_ = ABS(dVar40);
  dVar41 = *p1 - dVar118;
  auVar46._0_8_ = ABS(dVar41);
  auVar46._8_8_ = ABS(dVar74);
  auVar2._8_4_ = SUB84(dVar66,0);
  auVar2._0_8_ = dVar98;
  auVar2._12_4_ = (int)((ulong)dVar66 >> 0x20);
  auVar77._0_8_ = ABS(dVar98);
  auVar77._8_8_ = ABS(dVar66);
  auVar59._0_8_ = ABS(dVar68);
  auVar59._8_8_ = ABS(dVar73);
  auVar56 = maxpd(auVar59,auVar56);
  auVar56 = maxpd(auVar46,auVar56);
  auVar56 = maxpd(auVar94,auVar56);
  auVar56 = maxpd(auVar28,auVar56);
  auVar56 = maxpd(auVar77,auVar56);
  auVar81 = maxpd(auVar105,auVar81);
  auVar81 = maxpd(auVar113,auVar81);
  auVar81 = maxpd(auVar120,auVar81);
  auVar81 = maxpd(auVar126,auVar81);
  auVar105 = maxpd(auVar104,auVar81);
  auVar81 = maxpd(local_638._0_16_,auVar27);
  auVar81 = maxpd(local_648,auVar81);
  auVar29 = maxpd(auVar29,auVar81);
  auVar127._8_8_ = dVar21;
  auVar127._0_8_ = ABS(dVar88);
  auVar11._8_8_ = dVar83;
  auVar11._0_8_ = ABS(dVar78);
  auVar29 = maxpd(auVar11,auVar29);
  auVar29 = maxpd(auVar128,auVar29);
  auVar29 = maxpd(local_578._0_16_,auVar29);
  auVar128 = maxpd(auVar127,auVar105);
  dVar66 = auVar29._8_8_;
  uVar50 = auVar29._8_4_;
  uVar51 = auVar29._12_4_;
  dVar83 = auVar29._0_8_;
  dVar75 = dVar83;
  if ((dVar66 <= dVar83) && (dVar75 = dVar66, dVar66 < dVar83)) {
    uVar50 = auVar29._0_4_;
    uVar51 = auVar29._4_4_;
  }
  auVar29 = maxpd(local_5d8._0_16_,auVar56);
  dVar123 = auVar128._0_8_;
  dVar130 = auVar128._8_8_;
  dVar21 = dVar123;
  if ((dVar75 <= dVar123) &&
     (dVar21 = dVar75,
     (double)CONCAT44(uVar51,uVar50) <= dVar123 && dVar123 != (double)CONCAT44(uVar51,uVar50))) {
    uVar50 = auVar128._0_4_;
    uVar51 = auVar128._4_4_;
  }
  dVar54 = auVar29._0_8_;
  dVar119 = auVar29._8_8_;
  dVar75 = dVar54;
  if ((dVar21 <= dVar54) &&
     (dVar75 = dVar21,
     (double)CONCAT44(uVar51,uVar50) <= dVar54 && dVar54 != (double)CONCAT44(uVar51,uVar50))) {
    uVar50 = auVar29._0_4_;
    uVar51 = auVar29._4_4_;
  }
  dVar21 = dVar119;
  if ((dVar75 <= dVar119) &&
     (dVar21 = dVar75,
     (double)CONCAT44(uVar51,uVar50) <= dVar119 && dVar119 != (double)CONCAT44(uVar51,uVar50))) {
    uVar50 = auVar29._8_4_;
    uVar51 = auVar29._12_4_;
  }
  dVar75 = dVar130;
  if ((dVar21 <= dVar130) &&
     (dVar75 = dVar21,
     (double)CONCAT44(uVar51,uVar50) <= dVar130 && dVar130 != (double)CONCAT44(uVar51,uVar50))) {
    uVar50 = auVar128._8_4_;
    uVar51 = auVar128._12_4_;
  }
  iVar12 = 0;
  iVar15 = 0;
  if ((2.825284831947541e-50 <= dVar75) &&
     (iVar15 = iVar12,
     (double)CONCAT44(uVar51,uVar50) < 4.8357032784585156e+24 ||
     (double)CONCAT44(uVar51,uVar50) == 4.8357032784585156e+24)) {
    dStack_5c0 = auVar1._8_8_;
    dStack_4e0 = auVar5._8_8_;
    dStack_550 = auVar2._8_8_;
    dVar22 = dVar19 * dVar100 +
             dStack_5c0 * dVar37 +
             dVar38 * dVar108 +
             dVar7 * dVar99 +
             dVar17 * dVar107 + dVar78 * dVar97 + dVar62 * dVar96 + dVar35 * dVar106;
    dVar23 = dVar19 * dVar31 +
             dStack_5c0 * dStack_4e0 +
             dVar38 * dVar82 +
             dVar7 * dVar26 + dVar17 * dVar18 + dVar78 * dVar65 + dVar62 * dVar85 + dVar35 * dVar30;
    dVar111 = dVar68 * dVar100 +
              dVar40 * dVar37 +
              dVar34 * dVar108 +
              dVar89 * dVar99 +
              dVar20 * dVar107 + dVar61 * dVar97 + dVar41 * dVar96 + dVar98 * dVar106;
    dVar116 = dVar68 * dVar49 +
              dVar40 * dStack_550 +
              dVar34 * dVar48 +
              dVar89 * dVar64 +
              dVar20 * dVar74 + dVar61 * dVar73 + dVar41 * dVar39 + dVar98 * dVar32;
    dVar101 = dVar68 * dVar31 +
              dVar40 * dStack_4e0 +
              dVar34 * dVar82 +
              dVar89 * dVar26 +
              dVar20 * dVar18 + dVar61 * dVar65 + dVar41 * dVar85 + dVar98 * dVar30;
    dVar8 = dVar19 * dVar49 +
            dStack_5c0 * dStack_550 +
            dVar38 * dVar48 +
            dVar7 * dVar64 + dVar17 * dVar74 + dVar78 * dVar73 + dVar62 * dVar39 + dVar35 * dVar32;
    dVar33 = auVar6._8_8_;
    dVar63 = dVar68 * dVar33 +
             dVar40 * dVar72 +
             dVar34 * dVar129 +
             dVar89 * dVar121 +
             dVar20 * dVar114 + dVar61 * dVar87 + dVar41 * dVar95 + dVar98 * dVar84;
    dVar110 = dVar19 * dVar33 +
              dStack_5c0 * dVar72 +
              dVar38 * dVar129 +
              dVar7 * dVar121 +
              dVar17 * dVar114 + dVar78 * dVar87 + dVar62 * dVar95 + dVar35 * dVar84;
    dVar75 = dVar88 * dVar100 +
             dVar67 * dVar37 +
             dVar122 * dVar108 +
             dVar115 * dVar99 +
             dVar36 * dVar107 + dVar109 * dVar97 + dVar79 * dVar96 + dVar86 * dVar106;
    dVar124 = dVar88 * dVar31 +
              dVar67 * dStack_4e0 +
              dVar122 * dVar82 +
              dVar115 * dVar26 +
              dVar36 * dVar18 + dVar109 * dVar65 + dVar79 * dVar85 + dVar86 * dVar30;
    dVar57 = dVar88 * dVar33 +
             dVar67 * dVar72 +
             dVar122 * dVar129 +
             dVar115 * dVar121 +
             dVar36 * dVar114 + dVar109 * dVar87 + dVar79 * dVar95 + dVar86 * dVar84;
    dVar24 = dVar88 * dVar49 +
             dVar67 * dStack_550 +
             dVar122 * dVar48 +
             dVar115 * dVar64 +
             dVar36 * dVar74 + dVar109 * dVar73 + dVar79 * dVar39 + dVar86 * dVar32;
    dVar8 = dVar8 + dVar8;
    dVar110 = dVar110 + dVar110;
    dVar57 = dVar57 + dVar57;
    dVar24 = dVar24 + dVar24;
    dVar80 = dVar110 * dVar24 - dVar57 * dVar8;
    dVar116 = dVar116 + dVar116;
    dVar63 = dVar63 + dVar63;
    dVar69 = dVar63 * dVar24 - dVar57 * dVar116;
    dVar90 = dVar63 * dVar8 - dVar110 * dVar116;
    dVar23 = dVar23 + dVar23;
    dVar124 = dVar124 + dVar124;
    dVar21 = dVar23 * dVar57 - dVar124 * dVar110;
    dVar101 = dVar101 + dVar101;
    dVar117 = dVar101 * dVar57 - dVar124 * dVar63;
    dVar3 = dVar101 * dVar110 - dVar23 * dVar63;
    dVar22 = dVar22 + dVar22;
    dVar111 = dVar111 + dVar111;
    dVar9 = dVar124 * dVar90 + (dVar101 * dVar80 - dVar69 * dVar23);
    dVar75 = dVar75 + dVar75;
    dVar76 = dVar75 * dVar90 + (dVar111 * dVar80 - dVar69 * dVar22);
    dVar91 = dVar23 * dVar24 - dVar8 * dVar124;
    dVar58 = dVar101 * dVar24 - dVar116 * dVar124;
    dVar102 = dVar101 * dVar8 - dVar116 * dVar23;
    dVar92 = dVar75 * dVar102 + (dVar111 * dVar91 - dVar58 * dVar22);
    dVar103 = dVar75 * dVar3 + (dVar111 * dVar21 - dVar117 * dVar22);
    dVar42 = dVar54 * dVar66 * dVar83 * dVar130 * dVar123 * dVar119 * 4.3749289469473104e-11;
    dVar10 = ((dVar9 - dVar76) + dVar92) - dVar103;
    iVar12 = 1;
    if ((dVar42 < dVar10) || (iVar12 = -1, dVar10 < -dVar42)) {
      dVar118 = *p4 - dVar118;
      dVar4 = p4[1] - dVar4;
      dVar43 = p4[2] - dVar43;
      dVar112 = p4[3] - dVar112;
      dVar52 = p4[4] - dVar52;
      dVar125 = p4[5] - dVar125;
      dVar44 = p4[6] - dVar44;
      dVar45 = p4[7] - dVar45;
      auVar47._8_8_ = -(ulong)(dVar66 < dVar130);
      auVar47._0_8_ = -(ulong)(dVar83 < dVar123);
      uVar13 = movmskpd((int)p2,auVar47);
      dVar42 = dVar123;
      if ((uVar13 & 1) == 0) {
        dVar42 = dVar83;
      }
      dVar71 = ABS(dVar112);
      if (ABS(dVar112) <= dVar54) {
        dVar71 = dVar54;
      }
      dVar70 = ABS(dVar4);
      if (ABS(dVar4) <= dVar71) {
        dVar70 = dVar71;
      }
      dVar71 = ABS(dVar52);
      if (ABS(dVar52) <= dVar70) {
        dVar71 = dVar70;
      }
      dVar70 = ABS(dVar118);
      if (ABS(dVar118) <= dVar71) {
        dVar70 = dVar71;
      }
      dVar71 = ABS(dVar43);
      if (ABS(dVar43) <= dVar70) {
        dVar71 = dVar70;
      }
      dVar70 = ABS(dVar125);
      if (ABS(dVar125) <= dVar71) {
        dVar70 = dVar71;
      }
      dVar71 = ABS(dVar44);
      if (ABS(dVar44) <= dVar70) {
        dVar71 = dVar70;
      }
      dVar70 = ABS(dVar45);
      if (ABS(dVar45) <= dVar71) {
        dVar70 = dVar71;
      }
      dVar71 = dVar70;
      if (dVar70 <= dVar42) {
        dVar71 = dVar42;
      }
      dVar42 = dVar54;
      if (dVar54 <= dVar71) {
        dVar42 = dVar71;
      }
      auVar60._8_8_ = -(ulong)(dVar42 < dVar119);
      auVar60._0_8_ = -(ulong)(dVar70 < dVar54);
      uVar16 = movmskpd((int)p1,auVar60);
      dVar71 = dVar119;
      if ((uVar16 & 2) == 0) {
        dVar71 = dVar42;
      }
      dVar42 = dVar54;
      if ((uVar16 & 1) == 0) {
        dVar42 = dVar70;
      }
      dVar25 = dVar130;
      if (dVar130 <= dVar42) {
        dVar25 = dVar42;
      }
      dVar42 = dVar130;
      if ((uVar13 & 2) == 0) {
        dVar42 = dVar66;
      }
      dVar53 = dVar42;
      if (dVar42 <= dVar66) {
        dVar53 = dVar66;
      }
      if (dVar54 <= dVar53) {
        dVar54 = dVar53;
      }
      if (dVar119 <= dVar54) {
        dVar119 = dVar54;
      }
      dVar66 = dVar25;
      dVar54 = dVar42;
      if ((dVar42 <= dVar25) && (dVar66 = dVar42, dVar42 < dVar25)) {
        dVar54 = dVar25;
      }
      if (dVar130 <= dVar119) {
        dVar130 = dVar119;
      }
      dVar119 = dVar71;
      if ((dVar66 <= dVar71) && (dVar119 = dVar66, dVar54 < dVar71)) {
        dVar54 = dVar71;
      }
      dVar66 = dVar83;
      if (dVar119 <= dVar83) {
        dVar66 = dVar119;
      }
      dVar119 = dVar123;
      if (dVar66 <= dVar123) {
        dVar119 = dVar66;
      }
      dVar66 = dVar70;
      if (dVar119 <= dVar70) {
        dVar66 = dVar119;
      }
      dVar119 = dVar130;
      if ((dVar66 <= dVar130) && (dVar119 = dVar66, dVar54 < dVar130)) {
        dVar54 = dVar130;
      }
      if ((4.1740251859728477e-38 <= dVar119) && (dVar54 <= 4.8357032784585156e+24)) {
        dVar66 = dVar8 * dVar75 - dVar24 * dVar22;
        dVar54 = dVar116 * dVar75 - dVar24 * dVar111;
        dVar119 = dVar116 * dVar22 - dVar8 * dVar111;
        dVar62 = dVar19 * dVar19 +
                 dStack_5c0 * dStack_5c0 +
                 dVar38 * dVar38 +
                 dVar7 * dVar7 +
                 dVar17 * dVar17 + dVar78 * dVar78 + dVar62 * dVar62 + dVar35 * dVar35;
        dVar7 = dVar68 * dVar68 +
                dVar40 * dVar40 +
                dVar34 * dVar34 +
                dVar89 * dVar89 +
                dVar20 * dVar20 + dVar61 * dVar61 + dVar41 * dVar41 + dVar98 * dVar98;
        dVar17 = dVar22 * dVar124 - dVar75 * dVar23;
        dVar61 = dVar124 * dVar111 - dVar75 * dVar101;
        dVar34 = dVar111 * dVar23 - dVar22 * dVar101;
        dVar86 = dVar88 * dVar88 +
                 dVar67 * dVar67 +
                 dVar122 * dVar122 +
                 dVar115 * dVar115 +
                 dVar36 * dVar36 + dVar109 * dVar109 + dVar79 * dVar79 + dVar86 * dVar86;
        dVar96 = dVar100 * dVar45 +
                 dVar37 * dVar44 +
                 dVar108 * dVar125 +
                 dVar99 * dVar52 +
                 dVar107 * dVar112 + dVar97 * dVar43 + dVar96 * dVar118 + dVar106 * dVar4;
        dVar65 = dVar31 * dVar45 +
                 dStack_4e0 * dVar44 +
                 dVar82 * dVar125 +
                 dVar26 * dVar52 +
                 dVar18 * dVar112 + dVar65 * dVar43 + dVar85 * dVar118 + dVar30 * dVar4;
        dVar30 = dVar33 * dVar45 +
                 dVar72 * dVar44 +
                 dVar129 * dVar125 +
                 dVar121 * dVar52 +
                 dVar114 * dVar112 + dVar87 * dVar43 + dVar95 * dVar118 + dVar84 * dVar4;
        dVar26 = dVar49 * dVar45 +
                 dStack_550 * dVar44 +
                 dVar48 * dVar125 +
                 dVar64 * dVar52 +
                 dVar74 * dVar112 + dVar73 * dVar43 + dVar39 * dVar118 + dVar32 * dVar4;
        dVar83 = dVar71 * dVar25 * dVar70 * dVar42 * dVar83 * dVar130 * dVar123 * dVar130 *
                 2.4149264560725403e-09;
        dVar52 = dVar10 * (dVar45 * dVar45 +
                          dVar44 * dVar44 +
                          dVar125 * dVar125 +
                          dVar52 * dVar52 +
                          dVar112 * dVar112 + dVar43 * dVar43 + dVar118 * dVar118 + dVar4 * dVar4) -
                 (((((dVar63 * dVar22 - dVar110 * dVar111) + dVar3 + dVar34) * dVar86 +
                   (((dVar110 * dVar75 - dVar22 * dVar57) + dVar21 + dVar17) * dVar7 -
                   ((dVar63 * dVar75 - dVar57 * dVar111) + dVar117 + dVar61) * dVar62)) - dVar103) *
                  (dVar26 + dVar26) +
                 (dVar92 + (((dVar58 + dVar54 + dVar61) * dVar62 -
                            (dVar91 + dVar66 + dVar17) * dVar7) -
                           (dVar102 + dVar119 + dVar34) * dVar86)) * (dVar30 + dVar30) +
                 ((((dVar110 * dVar111 - dVar63 * dVar22) + dVar90 + dVar119) * dVar86 +
                  (((dVar22 * dVar57 - dVar110 * dVar75) + dVar80 + dVar66) * dVar7 -
                  ((dVar57 * dVar111 - dVar63 * dVar75) + dVar69 + dVar54) * dVar62)) - dVar76) *
                 (dVar65 + dVar65) +
                 (dVar9 + ((((dVar116 * dVar124 - dVar101 * dVar24) + dVar69 + dVar117) * dVar62 -
                           ((dVar8 * dVar124 - dVar23 * dVar24) + dVar80 + dVar21) * dVar7) -
                          ((dVar116 * dVar23 - dVar101 * dVar8) + dVar90 + dVar3) * dVar86)) *
                 (dVar96 + dVar96));
        iVar14 = 1;
        if ((dVar83 < dVar52) || (iVar14 = -1, dVar52 < -dVar83)) {
          iVar15 = iVar14 * iVar12;
        }
      }
    }
  }
  return iVar15;
}

Assistant:

inline int side4_8d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* p4, const double* q0, const double* q1, const double* q2, const double* q3) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double p3_7_p0_7 = (p3[7] - p0[7]);
    double l3;
    l3 = (1 * ((((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)) + (p3_7_p0_7 * p3_7_p0_7)));
    double p4_0_p0_0 = (p4[0] - p0[0]);
    double p4_1_p0_1 = (p4[1] - p0[1]);
    double p4_2_p0_2 = (p4[2] - p0[2]);
    double p4_3_p0_3 = (p4[3] - p0[3]);
    double p4_4_p0_4 = (p4[4] - p0[4]);
    double p4_5_p0_5 = (p4[5] - p0[5]);
    double p4_6_p0_6 = (p4[6] - p0[6]);
    double p4_7_p0_7 = (p4[7] - p0[7]);
    double l4;
    l4 = (1 * ((((((((p4_0_p0_0 * p4_0_p0_0) + (p4_1_p0_1 * p4_1_p0_1)) + (p4_2_p0_2 * p4_2_p0_2)) + (p4_3_p0_3 * p4_3_p0_3)) + (p4_4_p0_4 * p4_4_p0_4)) + (p4_5_p0_5 * p4_5_p0_5)) + (p4_6_p0_6 * p4_6_p0_6)) + (p4_7_p0_7 * p4_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double q2_7_p0_7 = (q2[7] - p0[7]);
    double a12;
    a12 = (2 * ((((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)) + (p1_7_p0_7 * q2_7_p0_7)));
    double q3_0_p0_0 = (q3[0] - p0[0]);
    double q3_1_p0_1 = (q3[1] - p0[1]);
    double q3_2_p0_2 = (q3[2] - p0[2]);
    double q3_3_p0_3 = (q3[3] - p0[3]);
    double q3_4_p0_4 = (q3[4] - p0[4]);
    double q3_5_p0_5 = (q3[5] - p0[5]);
    double q3_6_p0_6 = (q3[6] - p0[6]);
    double q3_7_p0_7 = (q3[7] - p0[7]);
    double a13;
    a13 = (2 * ((((((((p1_0_p0_0 * q3_0_p0_0) + (p1_1_p0_1 * q3_1_p0_1)) + (p1_2_p0_2 * q3_2_p0_2)) + (p1_3_p0_3 * q3_3_p0_3)) + (p1_4_p0_4 * q3_4_p0_4)) + (p1_5_p0_5 * q3_5_p0_5)) + (p1_6_p0_6 * q3_6_p0_6)) + (p1_7_p0_7 * q3_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double a22;
    a22 = (2 * ((((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)) + (p2_7_p0_7 * q2_7_p0_7)));
    double a23;
    a23 = (2 * ((((((((p2_0_p0_0 * q3_0_p0_0) + (p2_1_p0_1 * q3_1_p0_1)) + (p2_2_p0_2 * q3_2_p0_2)) + (p2_3_p0_3 * q3_3_p0_3)) + (p2_4_p0_4 * q3_4_p0_4)) + (p2_5_p0_5 * q3_5_p0_5)) + (p2_6_p0_6 * q3_6_p0_6)) + (p2_7_p0_7 * q3_7_p0_7)));
    double a30;
    a30 = (2 * ((((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)) + (p3_7_p0_7 * q0_7_p0_7)));
    double a31;
    a31 = (2 * ((((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)) + (p3_7_p0_7 * q1_7_p0_7)));
    double a32;
    a32 = (2 * ((((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)) + (p3_7_p0_7 * q2_7_p0_7)));
    double a33;
    a33 = (2 * ((((((((p3_0_p0_0 * q3_0_p0_0) + (p3_1_p0_1 * q3_1_p0_1)) + (p3_2_p0_2 * q3_2_p0_2)) + (p3_3_p0_3 * q3_3_p0_3)) + (p3_4_p0_4 * q3_4_p0_4)) + (p3_5_p0_5 * q3_5_p0_5)) + (p3_6_p0_6 * q3_6_p0_6)) + (p3_7_p0_7 * q3_7_p0_7)));
    double a40;
    a40 = (2 * ((((((((p4_0_p0_0 * q0_0_p0_0) + (p4_1_p0_1 * q0_1_p0_1)) + (p4_2_p0_2 * q0_2_p0_2)) + (p4_3_p0_3 * q0_3_p0_3)) + (p4_4_p0_4 * q0_4_p0_4)) + (p4_5_p0_5 * q0_5_p0_5)) + (p4_6_p0_6 * q0_6_p0_6)) + (p4_7_p0_7 * q0_7_p0_7)));
    double a41;
    a41 = (2 * ((((((((p4_0_p0_0 * q1_0_p0_0) + (p4_1_p0_1 * q1_1_p0_1)) + (p4_2_p0_2 * q1_2_p0_2)) + (p4_3_p0_3 * q1_3_p0_3)) + (p4_4_p0_4 * q1_4_p0_4)) + (p4_5_p0_5 * q1_5_p0_5)) + (p4_6_p0_6 * q1_6_p0_6)) + (p4_7_p0_7 * q1_7_p0_7)));
    double a42;
    a42 = (2 * ((((((((p4_0_p0_0 * q2_0_p0_0) + (p4_1_p0_1 * q2_1_p0_1)) + (p4_2_p0_2 * q2_2_p0_2)) + (p4_3_p0_3 * q2_3_p0_3)) + (p4_4_p0_4 * q2_4_p0_4)) + (p4_5_p0_5 * q2_5_p0_5)) + (p4_6_p0_6 * q2_6_p0_6)) + (p4_7_p0_7 * q2_7_p0_7)));
    double a43;
    a43 = (2 * ((((((((p4_0_p0_0 * q3_0_p0_0) + (p4_1_p0_1 * q3_1_p0_1)) + (p4_2_p0_2 * q3_2_p0_2)) + (p4_3_p0_3 * q3_3_p0_3)) + (p4_4_p0_4 * q3_4_p0_4)) + (p4_5_p0_5 * q3_5_p0_5)) + (p4_6_p0_6 * q3_6_p0_6)) + (p4_7_p0_7 * q3_7_p0_7)));
    double b00;
    b00 = (((a11 * ((a22 * a33) - (a23 * a32))) - (a21 * ((a12 * a33) - (a13 * a32)))) + (a31 * ((a12 * a23) - (a13 * a22))));
    double b01;
    b01 = -((((a22 * a33) - (a23 * a32)) + ((a23 * a31) - (a21 * a33))) + ((a21 * a32) - (a22 * a31)));
    double b02;
    b02 = ((((a12 * a33) - (a13 * a32)) + ((a13 * a31) - (a11 * a33))) + ((a11 * a32) - (a12 * a31)));
    double b03;
    b03 = -((((a12 * a23) - (a13 * a22)) + ((a13 * a21) - (a11 * a23))) + ((a11 * a22) - (a12 * a21)));
    double b10;
    b10 = -(((a10 * ((a22 * a33) - (a23 * a32))) - (a20 * ((a12 * a33) - (a13 * a32)))) + (a30 * ((a12 * a23) - (a13 * a22))));
    double b11;
    b11 = ((((a22 * a33) - (a23 * a32)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a32) - (a22 * a30)));
    double b12;
    b12 = -((((a12 * a33) - (a13 * a32)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a32) - (a12 * a30)));
    double b13;
    b13 = ((((a12 * a23) - (a13 * a22)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a22) - (a12 * a20)));
    double b20;
    b20 = (((a10 * ((a21 * a33) - (a23 * a31))) - (a20 * ((a11 * a33) - (a13 * a31)))) + (a30 * ((a11 * a23) - (a13 * a21))));
    double b21;
    b21 = -((((a21 * a33) - (a23 * a31)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a31) - (a21 * a30)));
    double b22;
    b22 = ((((a11 * a33) - (a13 * a31)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a31) - (a11 * a30)));
    double b23;
    b23 = -((((a11 * a23) - (a13 * a21)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a21) - (a11 * a20)));
    double b30;
    b30 = -(((a10 * ((a21 * a32) - (a22 * a31))) - (a20 * ((a11 * a32) - (a12 * a31)))) + (a30 * ((a11 * a22) - (a12 * a21))));
    double b31;
    b31 = ((((a21 * a32) - (a22 * a31)) + ((a22 * a30) - (a20 * a32))) + ((a20 * a31) - (a21 * a30)));
    double b32;
    b32 = -((((a11 * a32) - (a12 * a31)) + ((a12 * a30) - (a10 * a32))) + ((a10 * a31) - (a11 * a30)));
    double b33;
    b33 = ((((a11 * a22) - (a12 * a21)) + ((a12 * a20) - (a10 * a22))) + ((a10 * a21) - (a11 * a20)));
    double Delta;
    Delta = (((b00 + b10) + b20) + b30);
    double DeltaLambda0;
    DeltaLambda0 = ((((b01 * l1) + (b02 * l2)) + (b03 * l3)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = ((((b11 * l1) + (b12 * l2)) + (b13 * l3)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = ((((b21 * l1) + (b22 * l2)) + (b23 * l3)) + b20);
    double DeltaLambda3;
    DeltaLambda3 = ((((b31 * l1) + (b32 * l2)) + (b33 * l3)) + b30);
    double r;
    r = ((Delta * l4) - ((((a40 * DeltaLambda0) + (a41 * DeltaLambda1)) + (a42 * DeltaLambda2)) + (a43 * DeltaLambda3)));
    double eps;
    double max1 = fabs(p2_5_p0_5);
    if( (max1 < fabs(p2_3_p0_3)) )
    {
        max1 = fabs(p2_3_p0_3);
    } 
    if( (max1 < fabs(p2_0_p0_0)) )
    {
        max1 = fabs(p2_0_p0_0);
    } 
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    if( (max1 < fabs(p2_6_p0_6)) )
    {
        max1 = fabs(p2_6_p0_6);
    } 
    if( (max1 < fabs(p2_2_p0_2)) )
    {
        max1 = fabs(p2_2_p0_2);
    } 
    if( (max1 < fabs(p2_4_p0_4)) )
    {
        max1 = fabs(p2_4_p0_4);
    } 
    if( (max1 < fabs(p2_7_p0_7)) )
    {
        max1 = fabs(p2_7_p0_7);
    } 
    double max2 = fabs(p1_4_p0_4);
    if( (max2 < fabs(p1_3_p0_3)) )
    {
        max2 = fabs(p1_3_p0_3);
    } 
    if( (max2 < fabs(p1_7_p0_7)) )
    {
        max2 = fabs(p1_7_p0_7);
    } 
    if( (max2 < fabs(p1_0_p0_0)) )
    {
        max2 = fabs(p1_0_p0_0);
    } 
    if( (max2 < fabs(p1_2_p0_2)) )
    {
        max2 = fabs(p1_2_p0_2);
    } 
    if( (max2 < fabs(p1_5_p0_5)) )
    {
        max2 = fabs(p1_5_p0_5);
    } 
    if( (max2 < fabs(p1_1_p0_1)) )
    {
        max2 = fabs(p1_1_p0_1);
    } 
    if( (max2 < fabs(p1_6_p0_6)) )
    {
        max2 = fabs(p1_6_p0_6);
    } 
    double max3 = fabs(p3_3_p0_3);
    if( (max3 < fabs(p3_0_p0_0)) )
    {
        max3 = fabs(p3_0_p0_0);
    } 
    if( (max3 < fabs(p3_1_p0_1)) )
    {
        max3 = fabs(p3_1_p0_1);
    } 
    if( (max3 < fabs(p3_2_p0_2)) )
    {
        max3 = fabs(p3_2_p0_2);
    } 
    if( (max3 < fabs(p3_4_p0_4)) )
    {
        max3 = fabs(p3_4_p0_4);
    } 
    if( (max3 < fabs(p3_5_p0_5)) )
    {
        max3 = fabs(p3_5_p0_5);
    } 
    if( (max3 < fabs(p3_6_p0_6)) )
    {
        max3 = fabs(p3_6_p0_6);
    } 
    if( (max3 < fabs(p3_7_p0_7)) )
    {
        max3 = fabs(p3_7_p0_7);
    } 
    double max4 = fabs(q0_0_p0_0);
    if( (max4 < fabs(q0_1_p0_1)) )
    {
        max4 = fabs(q0_1_p0_1);
    } 
    if( (max4 < fabs(q0_2_p0_2)) )
    {
        max4 = fabs(q0_2_p0_2);
    } 
    if( (max4 < fabs(q0_3_p0_3)) )
    {
        max4 = fabs(q0_3_p0_3);
    } 
    if( (max4 < fabs(q0_4_p0_4)) )
    {
        max4 = fabs(q0_4_p0_4);
    } 
    if( (max4 < fabs(q0_5_p0_5)) )
    {
        max4 = fabs(q0_5_p0_5);
    } 
    if( (max4 < fabs(q0_6_p0_6)) )
    {
        max4 = fabs(q0_6_p0_6);
    } 
    if( (max4 < fabs(q0_7_p0_7)) )
    {
        max4 = fabs(q0_7_p0_7);
    } 
    if( (max4 < fabs(q1_0_p0_0)) )
    {
        max4 = fabs(q1_0_p0_0);
    } 
    if( (max4 < fabs(q1_1_p0_1)) )
    {
        max4 = fabs(q1_1_p0_1);
    } 
    if( (max4 < fabs(q1_2_p0_2)) )
    {
        max4 = fabs(q1_2_p0_2);
    } 
    if( (max4 < fabs(q1_3_p0_3)) )
    {
        max4 = fabs(q1_3_p0_3);
    } 
    if( (max4 < fabs(q1_4_p0_4)) )
    {
        max4 = fabs(q1_4_p0_4);
    } 
    if( (max4 < fabs(q1_5_p0_5)) )
    {
        max4 = fabs(q1_5_p0_5);
    } 
    if( (max4 < fabs(q1_6_p0_6)) )
    {
        max4 = fabs(q1_6_p0_6);
    } 
    if( (max4 < fabs(q1_7_p0_7)) )
    {
        max4 = fabs(q1_7_p0_7);
    } 
    double max5 = fabs(q1_0_p0_0);
    if( (max5 < fabs(q1_1_p0_1)) )
    {
        max5 = fabs(q1_1_p0_1);
    } 
    if( (max5 < fabs(q1_2_p0_2)) )
    {
        max5 = fabs(q1_2_p0_2);
    } 
    if( (max5 < fabs(q1_3_p0_3)) )
    {
        max5 = fabs(q1_3_p0_3);
    } 
    if( (max5 < fabs(q1_4_p0_4)) )
    {
        max5 = fabs(q1_4_p0_4);
    } 
    if( (max5 < fabs(q1_5_p0_5)) )
    {
        max5 = fabs(q1_5_p0_5);
    } 
    if( (max5 < fabs(q1_6_p0_6)) )
    {
        max5 = fabs(q1_6_p0_6);
    } 
    if( (max5 < fabs(q1_7_p0_7)) )
    {
        max5 = fabs(q1_7_p0_7);
    } 
    if( (max5 < fabs(q2_0_p0_0)) )
    {
        max5 = fabs(q2_0_p0_0);
    } 
    if( (max5 < fabs(q2_1_p0_1)) )
    {
        max5 = fabs(q2_1_p0_1);
    } 
    if( (max5 < fabs(q2_2_p0_2)) )
    {
        max5 = fabs(q2_2_p0_2);
    } 
    if( (max5 < fabs(q2_3_p0_3)) )
    {
        max5 = fabs(q2_3_p0_3);
    } 
    if( (max5 < fabs(q2_4_p0_4)) )
    {
        max5 = fabs(q2_4_p0_4);
    } 
    if( (max5 < fabs(q2_5_p0_5)) )
    {
        max5 = fabs(q2_5_p0_5);
    } 
    if( (max5 < fabs(q2_6_p0_6)) )
    {
        max5 = fabs(q2_6_p0_6);
    } 
    if( (max5 < fabs(q2_7_p0_7)) )
    {
        max5 = fabs(q2_7_p0_7);
    } 
    double max6 = fabs(q2_0_p0_0);
    if( (max6 < fabs(q2_1_p0_1)) )
    {
        max6 = fabs(q2_1_p0_1);
    } 
    if( (max6 < fabs(q2_2_p0_2)) )
    {
        max6 = fabs(q2_2_p0_2);
    } 
    if( (max6 < fabs(q2_3_p0_3)) )
    {
        max6 = fabs(q2_3_p0_3);
    } 
    if( (max6 < fabs(q2_4_p0_4)) )
    {
        max6 = fabs(q2_4_p0_4);
    } 
    if( (max6 < fabs(q2_5_p0_5)) )
    {
        max6 = fabs(q2_5_p0_5);
    } 
    if( (max6 < fabs(q2_6_p0_6)) )
    {
        max6 = fabs(q2_6_p0_6);
    } 
    if( (max6 < fabs(q2_7_p0_7)) )
    {
        max6 = fabs(q2_7_p0_7);
    } 
    if( (max6 < fabs(q3_0_p0_0)) )
    {
        max6 = fabs(q3_0_p0_0);
    } 
    if( (max6 < fabs(q3_1_p0_1)) )
    {
        max6 = fabs(q3_1_p0_1);
    } 
    if( (max6 < fabs(q3_2_p0_2)) )
    {
        max6 = fabs(q3_2_p0_2);
    } 
    if( (max6 < fabs(q3_3_p0_3)) )
    {
        max6 = fabs(q3_3_p0_3);
    } 
    if( (max6 < fabs(q3_4_p0_4)) )
    {
        max6 = fabs(q3_4_p0_4);
    } 
    if( (max6 < fabs(q3_5_p0_5)) )
    {
        max6 = fabs(q3_5_p0_5);
    } 
    if( (max6 < fabs(q3_6_p0_6)) )
    {
        max6 = fabs(q3_6_p0_6);
    } 
    if( (max6 < fabs(q3_7_p0_7)) )
    {
        max6 = fabs(q3_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max4;
    upper_bound_1 = max4;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    else 
    {
        if( (max6 > upper_bound_1) )
        {
            upper_bound_1 = max6;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    else 
    {
        if( (max5 > upper_bound_1) )
        {
            upper_bound_1 = max5;
        } 
    } 
    if( (lower_bound_1 < 2.82528483194754087282e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.37492894694731040560e-11 * (((((max2 * max4) * max1) * max5) * max3) * max6));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    int int_tmp_result_FFWKCAA;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    double max8 = max2;
    if( (max8 < fabs(p4_3_p0_3)) )
    {
        max8 = fabs(p4_3_p0_3);
    } 
    if( (max8 < fabs(p4_1_p0_1)) )
    {
        max8 = fabs(p4_1_p0_1);
    } 
    if( (max8 < fabs(p4_4_p0_4)) )
    {
        max8 = fabs(p4_4_p0_4);
    } 
    if( (max8 < fabs(p4_0_p0_0)) )
    {
        max8 = fabs(p4_0_p0_0);
    } 
    if( (max8 < fabs(p4_2_p0_2)) )
    {
        max8 = fabs(p4_2_p0_2);
    } 
    if( (max8 < fabs(p4_5_p0_5)) )
    {
        max8 = fabs(p4_5_p0_5);
    } 
    if( (max8 < fabs(p4_6_p0_6)) )
    {
        max8 = fabs(p4_6_p0_6);
    } 
    if( (max8 < fabs(p4_7_p0_7)) )
    {
        max8 = fabs(p4_7_p0_7);
    } 
    if( (max7 < max8) )
    {
        max7 = max8;
    } 
    if( (max7 < max2) )
    {
        max7 = max2;
    } 
    if( (max7 < max6) )
    {
        max7 = max6;
    } 
    double max9 = max8;
    if( (max9 < max2) )
    {
        max9 = max2;
    } 
    if( (max9 < max5) )
    {
        max9 = max5;
    } 
    double max10 = max4;
    double max11 = max4;
    if( (max11 < max5) )
    {
        max11 = max5;
    } 
    if( (max10 < max11) )
    {
        max10 = max11;
    } 
    if( (max10 < max2) )
    {
        max10 = max2;
    } 
    if( (max10 < max6) )
    {
        max10 = max6;
    } 
    if( (max10 < max5) )
    {
        max10 = max5;
    } 
    lower_bound_1 = max11;
    upper_bound_1 = max11;
    if( (max9 < lower_bound_1) )
    {
        lower_bound_1 = max9;
    } 
    else 
    {
        if( (max9 > upper_bound_1) )
        {
            upper_bound_1 = max9;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    else 
    {
        if( (max7 > upper_bound_1) )
        {
            upper_bound_1 = max7;
        } 
    } 
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max8 < lower_bound_1) )
    {
        lower_bound_1 = max8;
    } 
    if( (max10 < lower_bound_1) )
    {
        lower_bound_1 = max10;
    } 
    else 
    {
        if( (max10 > upper_bound_1) )
        {
            upper_bound_1 = max10;
        } 
    } 
    if( (lower_bound_1 < 4.17402518597284772324e-38) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.41492645607254025015e-09 * (((((((max8 * max11) * max1) * max10) * max3) * max10) * max9) * max7));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return (Delta_sign * int_tmp_result_FFWKCAA);
}